

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Isend(void *buf,int count,MPIABI_Datatype datatype,int dest,int tag,MPIABI_Comm comm,
                MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Isend();
  return iVar1;
}

Assistant:

int MPIABI_Isend(
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Isend(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}